

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::type_id> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::type_id_const&>
          (allocator_type<cs_impl::any::holder<cs::type_id>,64ul,cs_impl::default_allocator_provider>
           *this,type_id *args)

{
  long lVar1;
  size_t sVar2;
  holder<cs::type_id> *phVar3;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar3 = (holder<cs::type_id> *)operator_new(0x18);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar3 = *(holder<cs::type_id> **)(this + lVar1 * 8 + -8);
  }
  (phVar3->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_00374058;
  sVar2 = args->type_hash;
  (phVar3->mDat).type_idx._M_target = (args->type_idx)._M_target;
  (phVar3->mDat).type_hash = sVar2;
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}